

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllypticPoint.cpp
# Opt level: O2

void __thiscall EllypticPoint::EllypticPoint(EllypticPoint *this)

{
  BigInteger BStack_48;
  
  BigIntegerLibrary::BigInteger::BigInteger(&this->x);
  BigIntegerLibrary::BigInteger::BigInteger(&this->y);
  BigIntegerLibrary::BigInteger::BigInteger(&this->p,0x43);
  BigIntegerLibrary::BigInteger::BigInteger(&this->a,2);
  BigIntegerLibrary::BigInteger::BigInteger(&BStack_48,0);
  BigIntegerLibrary::BigInteger::operator=(&this->x,&BStack_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&BStack_48);
  BigIntegerLibrary::BigInteger::BigInteger(&BStack_48,0);
  BigIntegerLibrary::BigInteger::operator=(&this->y,&BStack_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&BStack_48);
  return;
}

Assistant:

EllypticPoint::EllypticPoint() {
    x = 0;
    y = 0;
}